

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

connectdata * Curl_cpool_get_conn(Curl_easy *data,curl_off_t conn_id)

{
  Curl_share *pCVar1;
  Curl_multi *pCVar2;
  cpool *cpool;
  cpool_find_ctx fctx;
  curl_off_t local_20;
  connectdata *local_18;
  
  if (data == (Curl_easy *)0x0) {
LAB_0011ac31:
    local_18 = (connectdata *)0x0;
  }
  else {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      pCVar2 = data->multi_easy;
      if ((pCVar2 == (Curl_multi *)0x0) && (pCVar2 = data->multi, pCVar2 == (Curl_multi *)0x0))
      goto LAB_0011ac31;
      cpool = &pCVar2->cpool;
    }
    else {
      cpool = &pCVar1->cpool;
    }
    local_18 = (connectdata *)0x0;
    local_20 = conn_id;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x68 = cpool->field_0x68 | 1;
    cpool_foreach(data,cpool,&local_20,cpool_find_conn);
    cpool->field_0x68 = cpool->field_0x68 & 0xfe;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return local_18;
}

Assistant:

struct connectdata *Curl_cpool_get_conn(struct Curl_easy *data,
                                        curl_off_t conn_id)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_find_ctx fctx;

  if(!cpool)
    return NULL;
  fctx.id = conn_id;
  fctx.conn = NULL;
  CPOOL_LOCK(cpool, data);
  cpool_foreach(data, cpool, &fctx, cpool_find_conn);
  CPOOL_UNLOCK(cpool, data);
  return fctx.conn;
}